

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jnt_convolve_avx2.c
# Opt level: O0

void av1_dist_wtd_convolve_2d_no_avg_copy_avx2
               (uint8_t *src,int src_stride,CONV_BUF_TYPE *dst,int dst_stride,int w,int h,
               __m256i offset_const)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined8 *puVar25;
  int in_ECX;
  undefined8 *in_RDX;
  int in_ESI;
  undefined1 (*in_RDI) [16];
  int in_R8D;
  int in_R9D;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  __m256i src_32;
  __m256i src_10;
  __m128i src_row_3;
  __m128i src_row_2;
  __m128i src_row_1;
  __m128i src_row_0;
  __m256i zero;
  __m256i src_3;
  __m256i src_2;
  __m256i src_1;
  __m256i src_0;
  int i;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 *puStack_1568;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  int local_1464;
  undefined8 *local_1418;
  undefined1 (*local_1408) [16];
  undefined8 local_880;
  undefined8 uStack_878;
  
  local_1464 = in_R9D;
  local_1418 = in_RDX;
  local_1408 = in_RDI;
  if (in_R8D < 0x10) {
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *(ulong *)*local_1408;
      auVar1._16_8_ = *(undefined8 *)(*local_1408 + in_ESI);
      auVar1._24_8_ = 0;
      auVar1 = vpunpcklbw_avx2(auVar1,ZEXT1632(ZEXT816(0)));
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)(*local_1408 + in_ESI * 2);
      auVar2._16_8_ = *(undefined8 *)(*local_1408 + in_ESI * 3);
      auVar2._24_8_ = 0;
      auVar2 = vpunpcklbw_avx2(auVar2,ZEXT1632(ZEXT816(0)));
      auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
      auVar2 = vpsllw_avx2(auVar2,ZEXT416(4));
      auVar4._8_8_ = in_XMM0_Qb;
      auVar4._0_8_ = in_XMM0_Qa;
      auVar4._16_8_ = in_YMM0_H;
      auVar4._24_8_ = in_register_00001218;
      auVar1 = vpaddw_avx2(auVar1,auVar4);
      auVar3._8_8_ = in_XMM0_Qb;
      auVar3._0_8_ = in_XMM0_Qa;
      auVar3._16_8_ = in_YMM0_H;
      auVar3._24_8_ = in_register_00001218;
      auVar2 = vpaddw_avx2(auVar2,auVar3);
      local_1580 = auVar1._0_8_;
      uStack_1578 = auVar1._8_8_;
      *local_1418 = local_1580;
      local_1418[1] = uStack_1578;
      puStack_1568 = auVar1._24_8_;
      *puStack_1568 = local_880;
      puStack_1568[1] = uStack_878;
      puVar25 = (undefined8 *)((long)local_1418 + (long)(in_ECX * 2) * 2);
      local_15a0 = auVar2._0_8_;
      uStack_1598 = auVar2._8_8_;
      uStack_1590 = auVar2._16_8_;
      uStack_1588 = auVar2._24_8_;
      *puVar25 = local_15a0;
      puVar25[1] = uStack_1598;
      puVar25 = (undefined8 *)((long)local_1418 + (long)(in_ECX * 3) * 2);
      *puVar25 = uStack_1590;
      puVar25[1] = uStack_1588;
      local_1408 = (undefined1 (*) [16])(*local_1408 + (in_ESI << 2));
      local_1418 = (undefined8 *)((long)local_1418 + (long)(in_ECX << 2) * 2);
      local_1464 = local_1464 + -4;
    } while (local_1464 != 0);
  }
  else if (in_R8D == 0x80) {
    do {
      auVar1 = vpmovzxbw_avx2(*local_1408);
      auVar2 = vpmovzxbw_avx2(local_1408[1]);
      auVar3 = vpmovzxbw_avx2(local_1408[2]);
      auVar4 = vpmovzxbw_avx2(local_1408[3]);
      auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
      auVar2 = vpsllw_avx2(auVar2,ZEXT416(4));
      auVar3 = vpsllw_avx2(auVar3,ZEXT416(4));
      auVar4 = vpsllw_avx2(auVar4,ZEXT416(4));
      auVar24._8_8_ = in_XMM0_Qb;
      auVar24._0_8_ = in_XMM0_Qa;
      auVar24._16_8_ = in_YMM0_H;
      auVar24._24_8_ = in_register_00001218;
      auVar1 = vpaddw_avx2(auVar1,auVar24);
      auVar23._8_8_ = in_XMM0_Qb;
      auVar23._0_8_ = in_XMM0_Qa;
      auVar23._16_8_ = in_YMM0_H;
      auVar23._24_8_ = in_register_00001218;
      auVar2 = vpaddw_avx2(auVar2,auVar23);
      auVar22._8_8_ = in_XMM0_Qb;
      auVar22._0_8_ = in_XMM0_Qa;
      auVar22._16_8_ = in_YMM0_H;
      auVar22._24_8_ = in_register_00001218;
      auVar3 = vpaddw_avx2(auVar3,auVar22);
      auVar21._8_8_ = in_XMM0_Qb;
      auVar21._0_8_ = in_XMM0_Qa;
      auVar21._16_8_ = in_YMM0_H;
      auVar21._24_8_ = in_register_00001218;
      auVar4 = vpaddw_avx2(auVar4,auVar21);
      local_14a0 = auVar1._0_8_;
      uStack_1498 = auVar1._8_8_;
      uStack_1490 = auVar1._16_8_;
      uStack_1488 = auVar1._24_8_;
      *local_1418 = local_14a0;
      local_1418[1] = uStack_1498;
      local_1418[2] = uStack_1490;
      local_1418[3] = uStack_1488;
      local_14c0 = auVar2._0_8_;
      uStack_14b8 = auVar2._8_8_;
      uStack_14b0 = auVar2._16_8_;
      uStack_14a8 = auVar2._24_8_;
      local_1418[4] = local_14c0;
      local_1418[5] = uStack_14b8;
      local_1418[6] = uStack_14b0;
      local_1418[7] = uStack_14a8;
      local_14e0 = auVar3._0_8_;
      uStack_14d8 = auVar3._8_8_;
      uStack_14d0 = auVar3._16_8_;
      uStack_14c8 = auVar3._24_8_;
      local_1418[8] = local_14e0;
      local_1418[9] = uStack_14d8;
      local_1418[10] = uStack_14d0;
      local_1418[0xb] = uStack_14c8;
      local_1500 = auVar4._0_8_;
      uStack_14f8 = auVar4._8_8_;
      uStack_14f0 = auVar4._16_8_;
      uStack_14e8 = auVar4._24_8_;
      local_1418[0xc] = local_1500;
      local_1418[0xd] = uStack_14f8;
      local_1418[0xe] = uStack_14f0;
      local_1418[0xf] = uStack_14e8;
      auVar1 = vpmovzxbw_avx2(local_1408[4]);
      auVar2 = vpmovzxbw_avx2(local_1408[5]);
      auVar3 = vpmovzxbw_avx2(local_1408[6]);
      auVar4 = vpmovzxbw_avx2(local_1408[7]);
      auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
      auVar2 = vpsllw_avx2(auVar2,ZEXT416(4));
      auVar3 = vpsllw_avx2(auVar3,ZEXT416(4));
      auVar4 = vpsllw_avx2(auVar4,ZEXT416(4));
      auVar20._8_8_ = in_XMM0_Qb;
      auVar20._0_8_ = in_XMM0_Qa;
      auVar20._16_8_ = in_YMM0_H;
      auVar20._24_8_ = in_register_00001218;
      auVar1 = vpaddw_avx2(auVar1,auVar20);
      auVar19._8_8_ = in_XMM0_Qb;
      auVar19._0_8_ = in_XMM0_Qa;
      auVar19._16_8_ = in_YMM0_H;
      auVar19._24_8_ = in_register_00001218;
      auVar2 = vpaddw_avx2(auVar2,auVar19);
      auVar18._8_8_ = in_XMM0_Qb;
      auVar18._0_8_ = in_XMM0_Qa;
      auVar18._16_8_ = in_YMM0_H;
      auVar18._24_8_ = in_register_00001218;
      auVar3 = vpaddw_avx2(auVar3,auVar18);
      auVar17._8_8_ = in_XMM0_Qb;
      auVar17._0_8_ = in_XMM0_Qa;
      auVar17._16_8_ = in_YMM0_H;
      auVar17._24_8_ = in_register_00001218;
      auVar4 = vpaddw_avx2(auVar4,auVar17);
      local_14a0 = auVar1._0_8_;
      uStack_1498 = auVar1._8_8_;
      uStack_1490 = auVar1._16_8_;
      uStack_1488 = auVar1._24_8_;
      local_1418[0x10] = local_14a0;
      local_1418[0x11] = uStack_1498;
      local_1418[0x12] = uStack_1490;
      local_1418[0x13] = uStack_1488;
      local_14c0 = auVar2._0_8_;
      uStack_14b8 = auVar2._8_8_;
      uStack_14b0 = auVar2._16_8_;
      uStack_14a8 = auVar2._24_8_;
      local_1418[0x14] = local_14c0;
      local_1418[0x15] = uStack_14b8;
      local_1418[0x16] = uStack_14b0;
      local_1418[0x17] = uStack_14a8;
      local_14e0 = auVar3._0_8_;
      uStack_14d8 = auVar3._8_8_;
      uStack_14d0 = auVar3._16_8_;
      uStack_14c8 = auVar3._24_8_;
      local_1418[0x18] = local_14e0;
      local_1418[0x19] = uStack_14d8;
      local_1418[0x1a] = uStack_14d0;
      local_1418[0x1b] = uStack_14c8;
      local_1500 = auVar4._0_8_;
      uStack_14f8 = auVar4._8_8_;
      uStack_14f0 = auVar4._16_8_;
      uStack_14e8 = auVar4._24_8_;
      local_1418[0x1c] = local_1500;
      local_1418[0x1d] = uStack_14f8;
      local_1418[0x1e] = uStack_14f0;
      local_1418[0x1f] = uStack_14e8;
      local_1408 = (undefined1 (*) [16])(*local_1408 + in_ESI);
      local_1418 = (undefined8 *)((long)local_1418 + (long)in_ECX * 2);
      local_1464 = local_1464 + -1;
    } while (local_1464 != 0);
  }
  else if (in_R8D == 0x40) {
    do {
      auVar1 = vpmovzxbw_avx2(*local_1408);
      auVar2 = vpmovzxbw_avx2(local_1408[1]);
      auVar3 = vpmovzxbw_avx2(local_1408[2]);
      auVar4 = vpmovzxbw_avx2(local_1408[3]);
      auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
      auVar2 = vpsllw_avx2(auVar2,ZEXT416(4));
      auVar3 = vpsllw_avx2(auVar3,ZEXT416(4));
      auVar4 = vpsllw_avx2(auVar4,ZEXT416(4));
      auVar16._8_8_ = in_XMM0_Qb;
      auVar16._0_8_ = in_XMM0_Qa;
      auVar16._16_8_ = in_YMM0_H;
      auVar16._24_8_ = in_register_00001218;
      auVar1 = vpaddw_avx2(auVar1,auVar16);
      auVar15._8_8_ = in_XMM0_Qb;
      auVar15._0_8_ = in_XMM0_Qa;
      auVar15._16_8_ = in_YMM0_H;
      auVar15._24_8_ = in_register_00001218;
      auVar2 = vpaddw_avx2(auVar2,auVar15);
      auVar14._8_8_ = in_XMM0_Qb;
      auVar14._0_8_ = in_XMM0_Qa;
      auVar14._16_8_ = in_YMM0_H;
      auVar14._24_8_ = in_register_00001218;
      auVar3 = vpaddw_avx2(auVar3,auVar14);
      auVar13._8_8_ = in_XMM0_Qb;
      auVar13._0_8_ = in_XMM0_Qa;
      auVar13._16_8_ = in_YMM0_H;
      auVar13._24_8_ = in_register_00001218;
      auVar4 = vpaddw_avx2(auVar4,auVar13);
      local_14a0 = auVar1._0_8_;
      uStack_1498 = auVar1._8_8_;
      uStack_1490 = auVar1._16_8_;
      uStack_1488 = auVar1._24_8_;
      *local_1418 = local_14a0;
      local_1418[1] = uStack_1498;
      local_1418[2] = uStack_1490;
      local_1418[3] = uStack_1488;
      local_14c0 = auVar2._0_8_;
      uStack_14b8 = auVar2._8_8_;
      uStack_14b0 = auVar2._16_8_;
      uStack_14a8 = auVar2._24_8_;
      local_1418[4] = local_14c0;
      local_1418[5] = uStack_14b8;
      local_1418[6] = uStack_14b0;
      local_1418[7] = uStack_14a8;
      local_14e0 = auVar3._0_8_;
      uStack_14d8 = auVar3._8_8_;
      uStack_14d0 = auVar3._16_8_;
      uStack_14c8 = auVar3._24_8_;
      local_1418[8] = local_14e0;
      local_1418[9] = uStack_14d8;
      local_1418[10] = uStack_14d0;
      local_1418[0xb] = uStack_14c8;
      local_1500 = auVar4._0_8_;
      uStack_14f8 = auVar4._8_8_;
      uStack_14f0 = auVar4._16_8_;
      uStack_14e8 = auVar4._24_8_;
      local_1418[0xc] = local_1500;
      local_1418[0xd] = uStack_14f8;
      local_1418[0xe] = uStack_14f0;
      local_1418[0xf] = uStack_14e8;
      local_1408 = (undefined1 (*) [16])(*local_1408 + in_ESI);
      local_1418 = (undefined8 *)((long)local_1418 + (long)in_ECX * 2);
      local_1464 = local_1464 + -1;
    } while (local_1464 != 0);
  }
  else if (in_R8D == 0x20) {
    do {
      auVar1 = vpmovzxbw_avx2(*local_1408);
      auVar2 = vpmovzxbw_avx2(*(undefined1 (*) [16])(*local_1408 + in_ESI));
      auVar3 = vpmovzxbw_avx2(local_1408[1]);
      auVar4 = vpmovzxbw_avx2(*(undefined1 (*) [16])(*local_1408 + (in_ESI + 0x10)));
      auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
      auVar2 = vpsllw_avx2(auVar2,ZEXT416(4));
      auVar3 = vpsllw_avx2(auVar3,ZEXT416(4));
      auVar4 = vpsllw_avx2(auVar4,ZEXT416(4));
      auVar12._8_8_ = in_XMM0_Qb;
      auVar12._0_8_ = in_XMM0_Qa;
      auVar12._16_8_ = in_YMM0_H;
      auVar12._24_8_ = in_register_00001218;
      auVar1 = vpaddw_avx2(auVar1,auVar12);
      auVar11._8_8_ = in_XMM0_Qb;
      auVar11._0_8_ = in_XMM0_Qa;
      auVar11._16_8_ = in_YMM0_H;
      auVar11._24_8_ = in_register_00001218;
      auVar2 = vpaddw_avx2(auVar2,auVar11);
      auVar10._8_8_ = in_XMM0_Qb;
      auVar10._0_8_ = in_XMM0_Qa;
      auVar10._16_8_ = in_YMM0_H;
      auVar10._24_8_ = in_register_00001218;
      auVar3 = vpaddw_avx2(auVar3,auVar10);
      auVar9._8_8_ = in_XMM0_Qb;
      auVar9._0_8_ = in_XMM0_Qa;
      auVar9._16_8_ = in_YMM0_H;
      auVar9._24_8_ = in_register_00001218;
      auVar4 = vpaddw_avx2(auVar4,auVar9);
      local_14a0 = auVar1._0_8_;
      uStack_1498 = auVar1._8_8_;
      uStack_1490 = auVar1._16_8_;
      uStack_1488 = auVar1._24_8_;
      *local_1418 = local_14a0;
      local_1418[1] = uStack_1498;
      local_1418[2] = uStack_1490;
      local_1418[3] = uStack_1488;
      puVar25 = (undefined8 *)((long)local_1418 + (long)in_ECX * 2);
      local_14c0 = auVar2._0_8_;
      uStack_14b8 = auVar2._8_8_;
      uStack_14b0 = auVar2._16_8_;
      uStack_14a8 = auVar2._24_8_;
      *puVar25 = local_14c0;
      puVar25[1] = uStack_14b8;
      puVar25[2] = uStack_14b0;
      puVar25[3] = uStack_14a8;
      local_14e0 = auVar3._0_8_;
      uStack_14d8 = auVar3._8_8_;
      uStack_14d0 = auVar3._16_8_;
      uStack_14c8 = auVar3._24_8_;
      local_1418[4] = local_14e0;
      local_1418[5] = uStack_14d8;
      local_1418[6] = uStack_14d0;
      local_1418[7] = uStack_14c8;
      puVar25 = (undefined8 *)((long)local_1418 + (long)(in_ECX + 0x10) * 2);
      local_1500 = auVar4._0_8_;
      uStack_14f8 = auVar4._8_8_;
      uStack_14f0 = auVar4._16_8_;
      uStack_14e8 = auVar4._24_8_;
      *puVar25 = local_1500;
      puVar25[1] = uStack_14f8;
      puVar25[2] = uStack_14f0;
      puVar25[3] = uStack_14e8;
      local_1408 = (undefined1 (*) [16])(*local_1408 + (in_ESI << 1));
      local_1418 = (undefined8 *)((long)local_1418 + (long)(in_ECX << 1) * 2);
      local_1464 = local_1464 + -2;
    } while (local_1464 != 0);
  }
  else if (in_R8D == 0x10) {
    do {
      auVar1 = vpmovzxbw_avx2(*local_1408);
      auVar2 = vpmovzxbw_avx2(*(undefined1 (*) [16])(*local_1408 + in_ESI));
      auVar3 = vpmovzxbw_avx2(*(undefined1 (*) [16])(*local_1408 + (in_ESI << 1)));
      auVar4 = vpmovzxbw_avx2(*(undefined1 (*) [16])(*local_1408 + in_ESI * 3));
      auVar1 = vpsllw_avx2(auVar1,ZEXT416(4));
      auVar2 = vpsllw_avx2(auVar2,ZEXT416(4));
      auVar3 = vpsllw_avx2(auVar3,ZEXT416(4));
      auVar4 = vpsllw_avx2(auVar4,ZEXT416(4));
      auVar8._8_8_ = in_XMM0_Qb;
      auVar8._0_8_ = in_XMM0_Qa;
      auVar8._16_8_ = in_YMM0_H;
      auVar8._24_8_ = in_register_00001218;
      auVar1 = vpaddw_avx2(auVar1,auVar8);
      auVar7._8_8_ = in_XMM0_Qb;
      auVar7._0_8_ = in_XMM0_Qa;
      auVar7._16_8_ = in_YMM0_H;
      auVar7._24_8_ = in_register_00001218;
      auVar2 = vpaddw_avx2(auVar2,auVar7);
      auVar6._8_8_ = in_XMM0_Qb;
      auVar6._0_8_ = in_XMM0_Qa;
      auVar6._16_8_ = in_YMM0_H;
      auVar6._24_8_ = in_register_00001218;
      auVar3 = vpaddw_avx2(auVar3,auVar6);
      auVar5._8_8_ = in_XMM0_Qb;
      auVar5._0_8_ = in_XMM0_Qa;
      auVar5._16_8_ = in_YMM0_H;
      auVar5._24_8_ = in_register_00001218;
      auVar4 = vpaddw_avx2(auVar4,auVar5);
      local_14a0 = auVar1._0_8_;
      uStack_1498 = auVar1._8_8_;
      uStack_1490 = auVar1._16_8_;
      uStack_1488 = auVar1._24_8_;
      *local_1418 = local_14a0;
      local_1418[1] = uStack_1498;
      local_1418[2] = uStack_1490;
      local_1418[3] = uStack_1488;
      puVar25 = (undefined8 *)((long)local_1418 + (long)in_ECX * 2);
      local_14c0 = auVar2._0_8_;
      uStack_14b8 = auVar2._8_8_;
      uStack_14b0 = auVar2._16_8_;
      uStack_14a8 = auVar2._24_8_;
      *puVar25 = local_14c0;
      puVar25[1] = uStack_14b8;
      puVar25[2] = uStack_14b0;
      puVar25[3] = uStack_14a8;
      puVar25 = (undefined8 *)((long)local_1418 + (long)(in_ECX << 1) * 2);
      local_14e0 = auVar3._0_8_;
      uStack_14d8 = auVar3._8_8_;
      uStack_14d0 = auVar3._16_8_;
      uStack_14c8 = auVar3._24_8_;
      *puVar25 = local_14e0;
      puVar25[1] = uStack_14d8;
      puVar25[2] = uStack_14d0;
      puVar25[3] = uStack_14c8;
      puVar25 = (undefined8 *)((long)local_1418 + (long)(in_ECX * 3) * 2);
      local_1500 = auVar4._0_8_;
      uStack_14f8 = auVar4._8_8_;
      uStack_14f0 = auVar4._16_8_;
      uStack_14e8 = auVar4._24_8_;
      *puVar25 = local_1500;
      puVar25[1] = uStack_14f8;
      puVar25[2] = uStack_14f0;
      puVar25[3] = uStack_14e8;
      local_1408 = (undefined1 (*) [16])(*local_1408 + (in_ESI << 2));
      local_1418 = (undefined8 *)((long)local_1418 + (long)(in_ECX << 2) * 2);
      local_1464 = local_1464 + -4;
    } while (local_1464 != 0);
  }
  return;
}

Assistant:

static inline void av1_dist_wtd_convolve_2d_no_avg_copy_avx2(
    const uint8_t *src, int src_stride, CONV_BUF_TYPE *dst, int dst_stride,
    int w, int h, const __m256i offset_const) {
  int i = h;
  if (w >= 16) {
    __m256i src_0, src_1, src_2, src_3;
    if (w == 128) {
      do {
        DO_NO_AVG_2D_COPY_4X16(0, 0, 0, 16, 0, 32, 0, 48);
        DO_NO_AVG_2D_COPY_4X16(0, 64, 0, 80, 0, 96, 0, 112);
        src += 1 * src_stride;
        dst += 1 * dst_stride;
        i -= 1;
      } while (i);
    } else if (w == 64) {
      do {
        DO_NO_AVG_2D_COPY_4X16(0, 0, 0, 16, 0, 32, 0, 48);
        src += 1 * src_stride;
        dst += 1 * dst_stride;
        i -= 1;
      } while (i);
    } else if (w == 32) {
      do {
        DO_NO_AVG_2D_COPY_4X16(0, 0, 1, 0, 0, 16, 1, 16);
        src += 2 * src_stride;
        dst += 2 * dst_stride;
        i -= 2;
      } while (i);
    } else if (w == 16) {
      do {
        DO_NO_AVG_2D_COPY_4X16(0, 0, 1, 0, 2, 0, 3, 0);
        src += 4 * src_stride;
        dst += 4 * dst_stride;
        i -= 4;
      } while (i);
    }
  } else {
    const __m256i zero = _mm256_setzero_si256();
    do {
      const __m128i src_row_0 =
          _mm_loadl_epi64((__m128i *)(&src[0 * src_stride]));
      const __m128i src_row_1 =
          _mm_loadl_epi64((__m128i *)(&src[1 * src_stride]));
      const __m128i src_row_2 =
          _mm_loadl_epi64((__m128i *)(&src[2 * src_stride]));
      const __m128i src_row_3 =
          _mm_loadl_epi64((__m128i *)(&src[3 * src_stride]));

      __m256i src_10 = _mm256_insertf128_si256(
          _mm256_castsi128_si256(src_row_0), src_row_1, 1);
      __m256i src_32 = _mm256_insertf128_si256(
          _mm256_castsi128_si256(src_row_2), src_row_3, 1);

      src_10 = _mm256_unpacklo_epi8(src_10, zero);
      src_32 = _mm256_unpacklo_epi8(src_32, zero);

      src_10 = _mm256_slli_epi16(src_10, LEFT_SHIFT);
      src_32 = _mm256_slli_epi16(src_32, LEFT_SHIFT);

      src_10 = _mm256_add_epi16(src_10, offset_const);
      src_32 = _mm256_add_epi16(src_32, offset_const);

      // Accumulate values into the destination buffer
      _mm_store_si128((__m128i *)(&dst[0 * dst_stride]),
                      _mm256_castsi256_si128(src_10));
      _mm_store_si128((__m128i *)(&dst[1 * dst_stride]),
                      _mm256_extracti128_si256(src_10, 1));
      _mm_store_si128((__m128i *)(&dst[2 * dst_stride]),
                      _mm256_castsi256_si128(src_32));
      _mm_store_si128((__m128i *)(&dst[3 * dst_stride]),
                      _mm256_extracti128_si256(src_32, 1));

      src += 4 * src_stride;
      dst += 4 * dst_stride;
      i -= 4;
    } while (i);
  }
}